

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O0

void __thiscall test_CEObserver::test_CEObserver(test_CEObserver *this)

{
  CEObserver *in_RDI;
  CEObserver *in_stack_fffffffffffffee8;
  double local_100;
  double local_f8;
  double local_f0;
  undefined4 local_e4;
  CEObserver *in_stack_ffffffffffffff20;
  double *in_stack_ffffffffffffff38;
  CEObserver *in_stack_ffffffffffffff40;
  
  CETestSuite::CETestSuite((CETestSuite *)in_RDI);
  in_RDI->_vptr_CEObserver = (_func_int **)&PTR__test_CEObserver_00152590;
  CEObserver::CEObserver(in_stack_ffffffffffffff20);
  local_e4 = 0;
  CEObserver::CEObserver
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(double *)0x0,(double *)0x0,
             (CEAngleType *)0x0);
  CEObserver::operator=(in_RDI,in_stack_fffffffffffffee8);
  CEObserver::~CEObserver(in_RDI);
  local_f0 = 1.0;
  CEObserver::SetWavelength_um((CEObserver *)&in_RDI[3].latitude_,&local_f0);
  local_f8 = 0.0;
  CEObserver::SetTemperature_C((CEObserver *)&in_RDI[3].latitude_,&local_f8);
  local_100 = 0.0;
  CEObserver::SetPressure_hPa((CEObserver *)&in_RDI[3].latitude_,&local_100);
  return;
}

Assistant:

test_CEObserver::test_CEObserver() :
    CETestSuite()
{
    base_obs_ = CEObserver(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    base_obs_.SetWavelength_um(1.0);
    base_obs_.SetTemperature_C(0.0);
    base_obs_.SetPressure_hPa(0.0);
}